

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

MergeResult
mergesort_cache_lcp_2way<true,unsigned_short>
          (uchar **strings_input,uchar **strings_output,lcp_t *lcp_input,lcp_t *lcp_output,
          unsigned_short *cache_input,unsigned_short *cache_output,size_t n)

{
  uchar **strings_output_00;
  lcp_t *lcp_output_00;
  uchar *puVar1;
  uint16_t uVar2;
  MergeResult MVar3;
  MergeResult MVar4;
  lcp_t depth;
  lcp_t lVar5;
  unsigned_short *puVar6;
  lcp_t *plVar7;
  uchar **ppuVar8;
  ulong uVar9;
  size_t n_00;
  uint uVar10;
  unsigned_short *cache_output_00;
  
  if (n < 0x20) {
    insertion_sort(strings_input,(int)n,(size_t)lcp_input);
    puVar1 = *strings_input;
    depth = lcp(puVar1,strings_input[1]);
    *lcp_input = depth;
    uVar2 = get_char<unsigned_short>(puVar1,0);
    *cache_input = uVar2;
    for (uVar10 = 2; uVar9 = (ulong)(uVar10 - 1), uVar9 < n - 1; uVar10 = uVar10 + 1) {
      puVar1 = strings_input[uVar9];
      lVar5 = lcp(puVar1,strings_input[uVar10]);
      lcp_input[uVar9] = lVar5;
      uVar2 = get_char<unsigned_short>(puVar1,depth);
      cache_input[uVar9] = uVar2;
      depth = lVar5;
    }
    uVar2 = get_char<unsigned_short>(strings_input[n - 1],lcp_input[n - 2]);
    cache_input[n - 1] = uVar2;
    check_input<unsigned_short>(strings_input,lcp_input,cache_input,n);
    return SortedInPlace;
  }
  uVar9 = n >> 1;
  MVar3 = mergesort_cache_lcp_2way<true,unsigned_short>
                    (strings_input,strings_output,lcp_input,lcp_output,cache_input,cache_output,
                     uVar9);
  puVar6 = cache_input;
  plVar7 = lcp_input;
  ppuVar8 = strings_input;
  if (MVar3 != SortedInPlace) {
    puVar6 = cache_output;
    plVar7 = lcp_output;
    ppuVar8 = strings_output;
  }
  check_input<unsigned_short>(ppuVar8,plVar7,puVar6,uVar9);
  ppuVar8 = strings_input + uVar9;
  strings_output_00 = strings_output + uVar9;
  plVar7 = lcp_input + uVar9;
  lcp_output_00 = lcp_output + uVar9;
  puVar6 = cache_input + uVar9;
  cache_output_00 = cache_output + uVar9;
  n_00 = n - uVar9;
  MVar4 = mergesort_cache_lcp_2way<true,unsigned_short>
                    (ppuVar8,strings_output_00,plVar7,lcp_output_00,puVar6,cache_output_00,n_00);
  if (MVar3 == SortedInPlace) {
    check_input<unsigned_short>(ppuVar8,plVar7,puVar6,n_00);
    if (MVar4 == SortedInPlace) {
      merge_cache_lcp_2way<true,unsigned_short>
                (strings_input,lcp_input,cache_input,uVar9,ppuVar8,plVar7,puVar6,n_00,strings_output
                 ,lcp_output,cache_output);
      return SortedInTemp;
    }
    memmove(strings_output,strings_input,uVar9 * 8);
    memcpy(cache_output,cache_input,n & 0xfffffffffffffffe);
    memcpy(lcp_output,lcp_input,uVar9 * 8);
    MVar3 = SortedInTemp;
  }
  else {
    check_input<unsigned_short>(strings_output_00,lcp_output_00,cache_output_00,n_00);
    if (MVar3 == MVar4) goto LAB_001ce0aa;
    memmove(strings_input,strings_output,uVar9 * 8);
    memcpy(cache_input,cache_output,n & 0xfffffffffffffffe);
    memcpy(lcp_input,lcp_output,uVar9 * 8);
    MVar4 = SortedInTemp;
  }
  if (MVar3 != MVar4) {
    __assert_fail("m0 == m1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x56e,
                  "MergeResult mergesort_cache_lcp_2way(unsigned char **, unsigned char **, lcp_t *__restrict, lcp_t *__restrict, CharT *__restrict, CharT *__restrict, size_t) [OutputLCP = true, CharT = unsigned short]"
                 );
  }
LAB_001ce0aa:
  merge_cache_lcp_2way<true,unsigned_short>
            (strings_output,lcp_output,cache_output,uVar9,strings_output_00,lcp_output_00,
             cache_output_00,n_00,strings_input,lcp_input,cache_input);
  return SortedInPlace;
}

Assistant:

MergeResult
mergesort_cache_lcp_2way(
              unsigned char** strings_input, unsigned char** strings_output,
              lcp_t* restrict lcp_input, lcp_t* restrict lcp_output,
              CharT* restrict cache_input, CharT* restrict cache_output,
              size_t n)
{
	debug() << __func__ << "(): n=" << n << '\n';
	if (n < 32) {
		insertion_sort(strings_input, n, 0);
		lcp_input[0] = lcp(strings_input[0], strings_input[1]);
		cache_input[0] = get_char<CharT>(strings_input[0], 0);
		for (unsigned i=1; i < n-1; ++i) {
			lcp_input[i] = lcp(strings_input[i], strings_input[i+1]);
			cache_input[i] = get_char<CharT>(strings_input[i], lcp_input[i-1]);
		}
		cache_input[n-1] = get_char<CharT>(strings_input[n-1], lcp_input[n-2]);
		check_input(strings_input, lcp_input, cache_input, n);
		return SortedInPlace;
	}
	const size_t split0 = n/2;
	MergeResult m0 = mergesort_cache_lcp_2way<true>(
			strings_input, strings_output,
			lcp_input, lcp_output,
			cache_input, cache_output,
			split0);

	if (m0==SortedInPlace) check_input(strings_input, lcp_input, cache_input, split0);
	else                   check_input(strings_output, lcp_output, cache_output, split0);

	MergeResult m1 = mergesort_cache_lcp_2way<true>(
			strings_input+split0, strings_output+split0,
			lcp_input+split0, lcp_output+split0,
			cache_input+split0, cache_output+split0,
			n-split0);

	if (m0==SortedInPlace) check_input(strings_input+split0, lcp_input+split0, cache_input+split0, n-split0);
	else                   check_input(strings_output+split0, lcp_output+split0, cache_output+split0, n-split0);

	if (m0 != m1) {
		debug() << "Warning: extra copying due to m0 != m1. n="<<n<<"\n";
		if (m0 == SortedInPlace) {
			std::copy(strings_input, strings_input+split0,
					strings_output);
			std::copy(cache_input, cache_input+split0,
					cache_output);
			std::copy(lcp_input, lcp_input+split0,
					lcp_output);
			m0 = SortedInTemp;
		} else {
			std::copy(strings_output, strings_output+split0,
					strings_input);
			std::copy(cache_output, cache_output+split0,
					cache_input);
			std::copy(lcp_output, lcp_output+split0,
					lcp_input);
			m1 = SortedInTemp;
		}
	}
	assert(m0 == m1);
	if (m0 == SortedInPlace) {
		merge_cache_lcp_2way<OutputLCP>(
			strings_input, lcp_input, cache_input, split0,
			strings_input+split0, lcp_input+split0, cache_input+split0, n-split0,
			strings_output, lcp_output, cache_output);
		return SortedInTemp;
	} else {
		merge_cache_lcp_2way<OutputLCP>(
			strings_output, lcp_output, cache_output, split0,
			strings_output+split0, lcp_output+split0, cache_output+split0, n-split0,
			strings_input, lcp_input, cache_input);
		return SortedInPlace;
	}
}